

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O3

void __thiscall leveldb::anon_unknown_6::TwoLevelIterator::~TwoLevelIterator(TwoLevelIterator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  pointer pcVar3;
  Iterator *pIVar4;
  char *pcVar5;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_Iterator)._vptr_Iterator = (_func_int **)&PTR__TwoLevelIterator_01397900;
  pcVar3 = (this->data_block_handle_)._M_dataplus._M_p;
  paVar1 = &(this->data_block_handle_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pIVar4 = (this->data_iter_).iter_;
  if (pIVar4 != (Iterator *)0x0) {
    (*pIVar4->_vptr_Iterator[1])();
  }
  pIVar4 = (this->index_iter_).iter_;
  if (pIVar4 != (Iterator *)0x0) {
    (*pIVar4->_vptr_Iterator[1])();
  }
  pcVar5 = (this->status_).state_;
  if (pcVar5 != (char *)0x0) {
    operator_delete__(pcVar5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    Iterator::~Iterator(&this->super_Iterator);
    return;
  }
  __stack_chk_fail();
}

Assistant:

TwoLevelIterator::~TwoLevelIterator() = default;